

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool search_directory_or_file(char *path,char *wildcard,_Bool isDirectory,char *result)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  DIR *__dirp;
  code *pcVar4;
  dirent *pdVar5;
  size_t sVar6;
  char *__s;
  char temp [260];
  char local_138 [264];
  
  if ((path != (char *)0x0) && (sVar3 = strlen(path), wildcard != (char *)0x0 && sVar3 != 0)) {
    if (sVar3 - 0x104 < 0xfffffffffffffefb) {
      return false;
    }
    if (*wildcard == '\0') {
      return false;
    }
    __dirp = opendir(path);
    if (__dirp != (DIR *)0x0) {
      if (isDirectory) {
        pcVar4 = exists_dir;
      }
      else {
        pcVar4 = exists_file;
      }
      do {
        do {
          do {
            pdVar5 = readdir(__dirp);
            if (pdVar5 == (dirent *)0x0) goto LAB_0014aa9c;
          } while ((pdVar5->d_name[0] == '.') &&
                  ((pdVar5->d_name[1] == '\0' ||
                   ((pdVar5->d_name[1] == '.' && (pdVar5->d_name[2] == '\0'))))));
          __s = pdVar5->d_name;
          sVar3 = strlen(path);
          sVar6 = strlen(__s);
        } while ((sVar6 + sVar3) - 0x102 < 0xfffffffffffffefb);
        strcpy(local_138,path);
        add_slash(local_138);
        strcat(local_138,__s);
        cVar1 = (*pcVar4)(local_138);
      } while ((cVar1 == '\0') || (_Var2 = wildcard_match(wildcard,__s), !_Var2));
      strcpy(result,local_138);
LAB_0014aa9c:
      closedir(__dirp);
      return pdVar5 != (dirent *)0x0;
    }
  }
  return false;
}

Assistant:

bool search_directory_or_file(const char *path, const char *wildcard, bool isDirectory, char *result)
{
	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}
	if (wildcard == NULL || strlen(wildcard) == 0)
	{
		return false;
	}
	if (strlen(path) + 1 > MAX_PATH)
	{
		return false;
	}
	DIR *dir;
	char opendirpath[MAX_PATH];
	clear_path_string(opendirpath, MAX_PATH);
#if defined(_WIN32)
	char *res = u8tosjis_path(path, opendirpath);
	if (res == NULL)
	{
		return false;
	}	
	if ((dir = opendir(opendirpath)) == NULL)
#else
	if ((dir = opendir(path)) == NULL)
#endif
	{
		return false;
	}
	char temp[MAX_PATH];
	struct dirent *entry;
	bool found = false;
	//size_t len = strlen(wildcard);
	while ((entry = readdir(dir)) != NULL)
	{
		if (strcmp(entry->d_name, ".") == 0 || strcmp(entry->d_name, "..") == 0)
		{
			continue;
		}
		if (strlen(path) + 1 + strlen(entry->d_name) + 2 > MAX_PATH)
		{
			continue;
		}
		strcpy(temp, path);
		add_slash(temp);
		strcat(temp, entry->d_name);
		if ((isDirectory ? exists_dir : exists_file)(temp))
		{
			if (!wildcard_match(wildcard, entry->d_name))
			{
				continue;
			}
			strcpy(result, temp);
			found = true;
			break;
		}
	}
	closedir(dir);
	return found;
}